

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_compression_utils.h
# Opt level: O0

void __thiscall
draco::OctahedronToolBox::IntegerVectorToQuantizedOctahedralCoords
          (OctahedronToolBox *this,int32_t *int_vec,int32_t *out_s,int32_t *out_t)

{
  int iVar1;
  int32_t *in_RCX;
  int32_t *in_RDX;
  int *in_RSI;
  OctahedronToolBox *in_RDI;
  int32_t t;
  int32_t s;
  int32_t local_28;
  int local_24;
  
  if (*in_RSI < 0) {
    if (in_RSI[1] < 0) {
      local_24 = in_RSI[2];
      if (local_24 < 1) {
        local_24 = -local_24;
      }
    }
    else {
      iVar1 = in_RSI[2];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      local_24 = in_RDI->max_value_ - iVar1;
    }
    if (in_RSI[2] < 0) {
      local_28 = in_RSI[1];
      if (local_28 < 1) {
        local_28 = -local_28;
      }
    }
    else {
      iVar1 = in_RSI[1];
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      local_28 = in_RDI->max_value_ - iVar1;
    }
  }
  else {
    local_24 = in_RSI[1] + in_RDI->center_value_;
    local_28 = in_RSI[2] + in_RDI->center_value_;
  }
  CanonicalizeOctahedralCoords(in_RDI,local_24,local_28,in_RDX,in_RCX);
  return;
}

Assistant:

inline void IntegerVectorToQuantizedOctahedralCoords(const int32_t *int_vec,
                                                       int32_t *out_s,
                                                       int32_t *out_t) const {
    DRACO_DCHECK_EQ(
        std::abs(int_vec[0]) + std::abs(int_vec[1]) + std::abs(int_vec[2]),
        center_value_);
    int32_t s, t;
    if (int_vec[0] >= 0) {
      // Right hemisphere.
      s = (int_vec[1] + center_value_);
      t = (int_vec[2] + center_value_);
    } else {
      // Left hemisphere.
      if (int_vec[1] < 0) {
        s = std::abs(int_vec[2]);
      } else {
        s = (max_value_ - std::abs(int_vec[2]));
      }
      if (int_vec[2] < 0) {
        t = std::abs(int_vec[1]);
      } else {
        t = (max_value_ - std::abs(int_vec[1]));
      }
    }
    CanonicalizeOctahedralCoords(s, t, out_s, out_t);
  }